

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_suite.cpp
# Opt level: O0

void ctor_suite::construct_array_from_iterator(void)

{
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> __l;
  __normal_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_*,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
  end;
  basic_variable<std::allocator<char>_> *local_110;
  undefined1 local_fb;
  undefined1 local_fa [2];
  basic_variable<std::allocator<char>_> *local_f8;
  basic_array<std::allocator<char>> *local_f0;
  undefined1 local_e8 [8];
  variable data;
  allocator<trial::dynamic::basic_variable<std::allocator<char>_>_> local_ad [13];
  basic_variable<std::allocator<char>_> *local_a0;
  basic_variable<std::allocator<char>_> local_98;
  basic_variable<std::allocator<char>_> local_68;
  undefined1 auStack_38 [32];
  vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  input;
  
  local_a0 = &local_98;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_a0,1);
  local_a0 = &local_68;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_a0,2);
  auStack_38._8_8_ = &local_98;
  auStack_38._16_8_ = 2;
  std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>::allocator(local_ad);
  __l._M_len = auStack_38._16_8_;
  __l._M_array = (iterator)auStack_38._8_8_;
  std::
  vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  ::vector((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
            *)(auStack_38 + 0x18),__l,local_ad);
  std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>::~allocator(local_ad);
  end._M_current = &local_98;
  local_110 = (basic_variable<std::allocator<char>_> *)auStack_38;
  do {
    local_110 = local_110 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_110);
  } while (local_110 != end._M_current);
  local_f0 = (basic_array<std::allocator<char>> *)
             std::
             vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
             ::begin((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
                      *)(auStack_38 + 0x18));
  local_f8 = (basic_variable<std::allocator<char>_> *)
             std::
             vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
             ::end((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
                    *)(auStack_38 + 0x18));
  trial::dynamic::basic_array<std::allocator<char>>::
  make<__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>>
            ((basic_variable<std::allocator<char>_> *)local_e8,local_f0,
             (__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>_>_*,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
              )local_f8,end);
  local_fa[0] = trial::dynamic::basic_variable<std::allocator<char>>::
                is<trial::dynamic::basic_array<std::allocator<char>>>
                          ((basic_variable<std::allocator<char>> *)local_e8);
  local_fb = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<array>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0xcb,"void ctor_suite::construct_array_from_iterator()",local_fa,&local_fb);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_e8);
  std::
  vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  ::~vector((vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
             *)(auStack_38 + 0x18));
  return;
}

Assistant:

void construct_array_from_iterator()
{
    std::vector<variable> input = { 1, 2 };
    variable data = array::make(input.begin(), input.end());
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<array>(), true);
}